

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_sampler.cc
# Opt level: O0

BandwidthSample * __thiscall
quic::BandwidthSampler::OnPacketAcknowledgedInner
          (BandwidthSample *__return_storage_ptr__,BandwidthSampler *this,QuicTime ack_time,
          QuicPacketNumber packet_number,ConnectionStateOnSentPacket *sent_packet)

{
  QuicTime lhs;
  QuicByteCount QVar1;
  bool bVar2;
  QuicByteCount QVar3;
  Delta DVar4;
  QuicBandwidth *pQVar5;
  QuicBandwidth local_d0;
  QuicBandwidth ack_rate;
  undefined1 local_a8 [8];
  AckPoint a0;
  QuicBandwidth local_68;
  QuicBandwidth send_rate;
  ConnectionStateOnSentPacket *sent_packet_local;
  BandwidthSampler *this_local;
  QuicPacketNumber packet_number_local;
  QuicTime ack_time_local;
  
  this->total_bytes_acked_ = sent_packet->size + this->total_bytes_acked_;
  this->total_bytes_sent_at_last_acked_packet_ = (sent_packet->send_time_state).total_bytes_sent;
  packet_number_local.packet_number_ = ack_time.time_;
  QuicTime::operator=(&this->last_acked_packet_sent_time_,&sent_packet->sent_time);
  QuicTime::operator=(&this->last_acked_packet_ack_time_,(QuicTime *)&packet_number_local);
  if ((this->overestimate_avoidance_ & 1U) != 0) {
    RecentAckPoints::Update
              (&this->recent_ack_points_,(QuicTime)packet_number_local.packet_number_,
               this->total_bytes_acked_);
  }
  if ((this->started_as_app_limited_ & 1U) == 0) {
    if ((((this->is_app_limited_ & 1U) != 0) &&
        (bVar2 = QuicPacketNumber::IsInitialized(&this->end_of_app_limited_phase_), bVar2)) &&
       (bVar2 = operator>(packet_number,
                          (QuicPacketNumber)(this->end_of_app_limited_phase_).packet_number_), bVar2
       )) {
      this->is_app_limited_ = false;
    }
  }
  else if (((this->is_app_limited_ & 1U) != 0) &&
          ((bVar2 = QuicPacketNumber::IsInitialized(&this->end_of_app_limited_phase_), !bVar2 ||
           (bVar2 = operator>(packet_number,
                              (QuicPacketNumber)(this->end_of_app_limited_phase_).packet_number_),
           bVar2)))) {
    this->is_app_limited_ = false;
  }
  lhs.time_ = (sent_packet->last_acked_packet_sent_time).time_;
  send_rate.bits_per_second_ = (int64_t)QuicTime::Zero();
  bVar2 = operator==(lhs,(QuicTime)send_rate.bits_per_second_);
  if (bVar2) {
    BandwidthSample::BandwidthSample(__return_storage_ptr__);
  }
  else {
    local_68 = QuicBandwidth::Infinite();
    bVar2 = operator>((QuicTime)(sent_packet->sent_time).time_,
                      (QuicTime)(sent_packet->last_acked_packet_sent_time).time_);
    if (bVar2) {
      QVar3 = (sent_packet->send_time_state).total_bytes_sent;
      QVar1 = sent_packet->total_bytes_sent_at_last_acked_packet;
      a0.total_bytes_acked = (sent_packet->last_acked_packet_sent_time).time_;
      DVar4 = operator-((sent_packet->sent_time).time_,(QuicTime)a0.total_bytes_acked);
      local_68 = QuicBandwidth::FromBytesAndTimeDelta(QVar3 - QVar1,DVar4);
    }
    AckPoint::AckPoint((AckPoint *)local_a8);
    if (((this->overestimate_avoidance_ & 1U) == 0) ||
       (bVar2 = ChooseA0Point(this,(sent_packet->send_time_state).total_bytes_acked,
                              (AckPoint *)local_a8), !bVar2)) {
      QuicTime::operator=((QuicTime *)local_a8,&sent_packet->last_acked_packet_ack_time);
      a0.ack_time.time_ = (sent_packet->send_time_state).total_bytes_acked;
    }
    bVar2 = operator<=((QuicTime)packet_number_local.packet_number_,(QuicTime)local_a8);
    if (bVar2) {
      ack_rate.bits_per_second_ = (sent_packet->sent_time).time_;
      operator==((QuicTime)local_a8,(QuicTime)ack_rate.bits_per_second_);
      BandwidthSample::BandwidthSample(__return_storage_ptr__);
    }
    else {
      QVar3 = this->total_bytes_acked_ - a0.ack_time.time_;
      DVar4 = operator-((QuicTime)packet_number_local.packet_number_,(QuicTime)local_a8);
      local_d0 = QuicBandwidth::FromBytesAndTimeDelta(QVar3,DVar4);
      BandwidthSample::BandwidthSample(__return_storage_ptr__);
      pQVar5 = std::min<quic::QuicBandwidth>(&local_68,&local_d0);
      (__return_storage_ptr__->bandwidth).bits_per_second_ = pQVar5->bits_per_second_;
      DVar4 = operator-((QuicTime)packet_number_local.packet_number_,(sent_packet->sent_time).time_)
      ;
      (__return_storage_ptr__->rtt).time_offset_ = DVar4.time_offset_;
      SentPacketToSendTimeState(this,sent_packet,&__return_storage_ptr__->state_at_send);
      QuicBandwidth::IsZero(&__return_storage_ptr__->bandwidth);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BandwidthSample BandwidthSampler::OnPacketAcknowledgedInner(
    QuicTime ack_time,
    QuicPacketNumber packet_number,
    const ConnectionStateOnSentPacket& sent_packet) {
  total_bytes_acked_ += sent_packet.size;
  total_bytes_sent_at_last_acked_packet_ =
      sent_packet.send_time_state.total_bytes_sent;
  last_acked_packet_sent_time_ = sent_packet.sent_time;
  last_acked_packet_ack_time_ = ack_time;
  if (overestimate_avoidance_) {
    recent_ack_points_.Update(ack_time, total_bytes_acked_);
  }

  if (started_as_app_limited_) {
    if (is_app_limited_) {
      // Exit app-limited phase in two cases:
      // (1) end_of_app_limited_phase_ is not initialized, i.e., so far all
      // packets are sent while there are buffered packets or pending data.
      // (2) The current acked packet is after the sent packet marked as the end
      // of the app limit phase.
      if (!end_of_app_limited_phase_.IsInitialized() ||
          packet_number > end_of_app_limited_phase_) {
       // QUIC_RELOADABLE_FLAG_COUNT(quic_bw_sampler_app_limited_starting_value);
        is_app_limited_ = false;
      }
    }
  } else {
    // Exit app-limited phase once a packet that was sent while the connection
    // is not app-limited is acknowledged.
    if (is_app_limited_ && end_of_app_limited_phase_.IsInitialized() &&
        packet_number > end_of_app_limited_phase_) {
      is_app_limited_ = false;
    }
  }

  // There might have been no packets acknowledged at the moment when the
  // current packet was sent. In that case, there is no bandwidth sample to
  // make.
  if (sent_packet.last_acked_packet_sent_time == QuicTime::Zero()) {
   // QUIC_BUG << "sent_packet.last_acked_packet_sent_time is zero";
    return BandwidthSample();
  }

  // Infinite rate indicates that the sampler is supposed to discard the
  // current send rate sample and use only the ack rate.
  QuicBandwidth send_rate = QuicBandwidth::Infinite();
  if (sent_packet.sent_time > sent_packet.last_acked_packet_sent_time) {
    send_rate = QuicBandwidth::FromBytesAndTimeDelta(
        sent_packet.send_time_state.total_bytes_sent -
            sent_packet.total_bytes_sent_at_last_acked_packet,
        sent_packet.sent_time - sent_packet.last_acked_packet_sent_time);
  }

  AckPoint a0;
  if (overestimate_avoidance_ &&
      ChooseA0Point(sent_packet.send_time_state.total_bytes_acked, &a0)) {
//    QUIC_DVLOG(2) << "Using a0 point: " << a0;
  } else {
    a0.ack_time = sent_packet.last_acked_packet_ack_time,
    a0.total_bytes_acked = sent_packet.send_time_state.total_bytes_acked;

  }

  // During the slope calculation, ensure that ack time of the current packet is
  // always larger than the time of the previous packet, otherwise division by
  // zero or integer underflow can occur.
  if (ack_time <= a0.ack_time) {
    // TODO(wub): Compare this code count before and after fixing clock jitter
    // issue.
    if (a0.ack_time == sent_packet.sent_time) {
      // This is the 1st packet after quiescense.
     // QUIC_CODE_COUNT_N(quic_prev_ack_time_larger_than_current_ack_time, 1, 2);
    } else {
      //QUIC_CODE_COUNT_N(quic_prev_ack_time_larger_than_current_ack_time, 2, 2);
    }
   // QUIC_LOG_EVERY_N_SEC(ERROR, 60)
        //<< "Time of the previously acked packet:"
        //<< a0.ack_time.ToDebuggingValue()
        //<< " is larger than the ack time of the current packet:"
        //<< ack_time.ToDebuggingValue()
        //<< ". acked packet number:" << packet_number
        //<< ", total_bytes_acked_:" << total_bytes_acked_
        //<< ", overestimate_avoidance_:" << overestimate_avoidance_
        //<< ", sent_packet:" << sent_packet;
    return BandwidthSample();
  }
  QuicBandwidth ack_rate = QuicBandwidth::FromBytesAndTimeDelta(
      total_bytes_acked_ - a0.total_bytes_acked, ack_time - a0.ack_time);

//  int aaa = packet_number.ToUint64();
//#ifdef OUTPUT_VERBOSE_INFO
//	  dd::OutputDebugInfo("packet_number = %d, acked rate = %f Mbyte/s, total_bytes_acked = %llu, ack_time = %llu, a0.total_bytes_acked = %llu, a0.ack_time = %llu\r\n",
//		   aaa, (float)ack_rate.ToBytesPerSecond() / 1024.0 / 1024.0, total_bytes_acked_, ack_time.ToDebuggingValue(),
//		   a0.total_bytes_acked, a0.ack_time.ToDebuggingValue());
//#endif

  BandwidthSample sample;
  sample.bandwidth = std::min(send_rate, ack_rate);
  // Note: this sample does not account for delayed acknowledgement time.  This
  // means that the RTT measurements here can be artificially high, especially
  // on low bandwidth connections.
  sample.rtt = ack_time - sent_packet.sent_time;
  SentPacketToSendTimeState(sent_packet, &sample.state_at_send);

  if (sample.bandwidth.IsZero()) {
    //QUIC_LOG_EVERY_N_SEC(ERROR, 60)
    //    << "ack_rate: " << ack_rate << ", send_rate: " << send_rate
    //    << ". acked packet number:" << packet_number
    //    << ", overestimate_avoidance_:" << overestimate_avoidance_ << "a1:{"
    //    << total_bytes_acked_ << "@" << ack_time << "}, a0:{"
    //    << a0.total_bytes_acked << "@" << a0.ack_time
    //    << "}, sent_packet:" << sent_packet;
  }
  return sample;
}